

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

void __thiscall
sqlite::Connection::exec
          (Connection *this,string *sql,_func_int_void_ptr_int_char_ptr_ptr_char_ptr_ptr *callback,
          void *arg)

{
  int sqlite_error_code;
  Logic_error *this_00;
  char *err_msg;
  string err;
  char *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  local_70 = (char *)0x0;
  sqlite_error_code = sqlite3_exec(this->db_,(sql->_M_dataplus)._M_p,callback,arg,&local_70);
  if ((local_70 == (char *)0x0) && (sqlite_error_code == 0)) {
    return;
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"");
  if (local_70 != (char *)0x0) {
    std::__cxx11::string::operator=((string *)&local_68,local_70);
    sqlite3_free(local_70);
  }
  this_00 = (Logic_error *)__cxa_allocate_exception(0x48);
  std::operator+(&local_48,"Error evaluating SQL: ",&local_68);
  Logic_error::Logic_error(this_00,&local_48,sql,sqlite_error_code,this->db_);
  __cxa_throw(this_00,&Logic_error::typeinfo,Logic_error::~Logic_error);
}

Assistant:

void Connection::exec(const std::string & sql, int (*callback)(void *, int, char **, char **), void * arg)
    {
        char * err_msg = nullptr;
        int status = sqlite3_exec(db_, sql.c_str(), callback, arg, &err_msg);

        if(err_msg || status != SQLITE_OK)
        {
            std::string err = "";
            if(err_msg)
            {
                err = err_msg;
                sqlite3_free(err_msg);
            }
            throw Logic_error("Error evaluating SQL: " + err, sql, status, db_);
        }
    }